

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockwidget.cpp
# Opt level: O2

void __thiscall QDockWidgetPrivate::setResizerActive(QDockWidgetPrivate *this,bool active)

{
  QWidget *parent;
  bool bVar1;
  QDockWidgetLayout *this_00;
  QWidgetResizeHandler *this_01;
  
  parent = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  this_00 = QtPrivate::qobject_cast_helper<QDockWidgetLayout*,QObject>
                      (&((this->super_QWidgetPrivate).layout)->super_QObject);
  bVar1 = QDockWidgetLayout::nativeWindowDeco
                    (this_00,(bool)((byte)(parent->data->window_flags).
                                          super_QFlagsStorageHelper<Qt::WindowType,_4>.
                                          super_QFlagsStorage<Qt::WindowType>.i & 1));
  if (bVar1) {
    return;
  }
  this_01 = this->resizer;
  if (active) {
    if (this_01 == (QWidgetResizeHandler *)0x0) {
      this_01 = (QWidgetResizeHandler *)operator_new(0x48);
      QWidgetResizeHandler::QWidgetResizeHandler
                ((QWidgetResizeHandler *)this_01,parent,(QWidget *)0x0);
      this->resizer = this_01;
    }
  }
  else if (this_01 == (QWidgetResizeHandler *)0x0) {
    return;
  }
  QWidgetResizeHandler::setEnabled((QWidgetResizeHandler *)this_01,active);
  return;
}

Assistant:

void QDockWidgetPrivate::setResizerActive(bool active)
{
    Q_Q(QDockWidget);
    const auto *dwLayout = qobject_cast<QDockWidgetLayout *>(layout);
    if (dwLayout->nativeWindowDeco(q->isFloating()))
        return;

    if (active && !resizer)
        resizer = new QWidgetResizeHandler(q);
    if (resizer)
        resizer->setEnabled(active);
}